

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMHMeshControl.cpp
# Opt level: O1

void __thiscall TPZMHMeshControl::DivideBoundarySkeletonElements(TPZMHMeshControl *this)

{
  TPZGeoEl *pTVar1;
  long *plVar2;
  long lVar3;
  _Base_ptr p_Var4;
  int64_t iVar5;
  int iVar6;
  TPZGeoEl **ppTVar7;
  mapped_type *pmVar8;
  _Base_ptr p_Var9;
  bool bVar10;
  long lVar11;
  _Base_ptr p_Var12;
  _Self __tmp;
  map<long,_std::pair<long,_long>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<long,_long>_>_>_>
  mapdivided;
  long local_108;
  _func_int **local_100;
  _func_int **local_f8;
  _Base_ptr local_f0;
  TPZManVector<long,_10> *local_e8;
  map<long,_std::pair<long,_long>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<long,_long>_>_>_>
  *local_e0;
  _Base_ptr local_d8;
  TPZVec<TPZGeoEl_*> local_d0;
  TPZGeoEl *local_b0 [10];
  _Rb_tree<long,_std::pair<const_long,_std::pair<long,_long>_>,_std::_Select1st<std::pair<const_long,_std::pair<long,_long>_>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<long,_long>_>_>_>
  local_60;
  
  local_e0 = &this->fInterfaces;
  local_f0 = &(this->fInterfaces)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_e8 = &this->fGeoToMHMDomain;
  local_100 = (_func_int **)&PTR__TPZManVector_01842498;
  local_f8 = (_func_int **)&PTR__TPZVec_0183b770;
  do {
    local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    bVar10 = false;
    local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_60._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_60._M_impl.super__Rb_tree_header._M_header;
    local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
    p_Var9 = (this->fInterfaces)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_60._M_impl.super__Rb_tree_header._M_header._M_right =
         local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    if (p_Var9 != local_f0) {
      bVar10 = false;
      do {
        p_Var12 = *(_Base_ptr *)(p_Var9 + 1);
        ppTVar7 = TPZChunkVector<TPZGeoEl_*,_10>::operator[]
                            (&(((this->fGMesh).fRef)->fPointer->fElementVec).
                              super_TPZChunkVector<TPZGeoEl_*,_10>,(int64_t)p_Var12);
        pTVar1 = *ppTVar7;
        iVar6 = (**(code **)(*(long *)pTVar1 + 0x1d0))(pTVar1);
        if (iVar6 == 0) {
          pmVar8 = std::
                   map<long,_std::pair<long,_long>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<long,_long>_>_>_>
                   ::operator[]((map<long,_std::pair<long,_long>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<long,_long>_>_>_>
                                 *)&local_60,(key_type_conflict1 *)(p_Var9 + 1));
          p_Var12 = p_Var9[1]._M_left;
          pmVar8->first = (long)p_Var9[1]._M_parent;
          pmVar8->second = (long)p_Var12;
        }
        else {
          TPZVec<TPZGeoEl_*>::TPZVec(&local_d0,0);
          local_d0._vptr_TPZVec = local_100;
          local_d0.fStore = local_b0;
          local_d0.fNElements = 0;
          local_d0.fNAlloc = 0;
          (**(code **)(*(long *)pTVar1 + 0x1c0))(pTVar1,&local_d0);
          iVar5 = local_d0.fNElements;
          if (0 < local_d0.fNElements) {
            lVar11 = 0;
            local_d8 = p_Var12;
            do {
              if ((this->fGeoToMHMDomain).super_TPZVec<long>.fNElements <=
                  local_d0.fStore[lVar11]->fIndex) {
                local_108 = -1;
                TPZManVector<long,_10>::Resize
                          (local_e8,local_d0.fStore[lVar11]->fIndex + 1000,&local_108);
              }
              plVar2 = (this->fGeoToMHMDomain).super_TPZVec<long>.fStore;
              plVar2[local_d0.fStore[lVar11]->fIndex] = plVar2[(long)p_Var12];
              local_108 = local_d0.fStore[lVar11]->fIndex;
              pmVar8 = std::
                       map<long,_std::pair<long,_long>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<long,_long>_>_>_>
                       ::operator[]((map<long,_std::pair<long,_long>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<long,_long>_>_>_>
                                     *)&local_60,&local_108);
              p_Var4 = p_Var9[1]._M_left;
              pmVar8->first = (long)p_Var9[1]._M_parent;
              pmVar8->second = (long)p_Var4;
              if (p_Var12 == p_Var9[1]._M_left) {
                lVar3 = local_d0.fStore[lVar11]->fIndex;
                local_108 = local_d0.fStore[lVar11]->fIndex;
                pmVar8 = std::
                         map<long,_std::pair<long,_long>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<long,_long>_>_>_>
                         ::operator[]((map<long,_std::pair<long,_long>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<long,_long>_>_>_>
                                       *)&local_60,&local_108);
                pmVar8->second = lVar3;
                p_Var12 = local_d8;
              }
              lVar11 = lVar11 + 1;
            } while (iVar5 != lVar11);
          }
          if (local_d0.fStore == local_b0) {
            local_d0.fStore = (TPZGeoEl **)0x0;
          }
          local_d0.fNAlloc = 0;
          local_d0._vptr_TPZVec = local_f8;
          if (local_d0.fStore != (TPZGeoEl **)0x0) {
            operator_delete__(local_d0.fStore);
          }
          bVar10 = true;
        }
        p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
      } while (p_Var9 != local_f0);
    }
    std::
    _Rb_tree<long,_std::pair<const_long,_std::pair<long,_long>_>,_std::_Select1st<std::pair<const_long,_std::pair<long,_long>_>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<long,_long>_>_>_>
    ::operator=(&local_e0->_M_t,&local_60);
    std::
    _Rb_tree<long,_std::pair<const_long,_std::pair<long,_long>_>,_std::_Select1st<std::pair<const_long,_std::pair<long,_long>_>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<long,_long>_>_>_>
    ::~_Rb_tree(&local_60);
  } while (bVar10);
  local_d0._vptr_TPZVec = (_func_int **)0xffffffffffffffff;
  TPZManVector<long,_10>::Resize
            (local_e8,(((this->fGMesh).fRef)->fPointer->fElementVec).
                      super_TPZChunkVector<TPZGeoEl_*,_10>.fNElements,(long *)&local_d0);
  return;
}

Assistant:

void TPZMHMeshControl::DivideBoundarySkeletonElements()
{
    std::map<int64_t, std::pair<int64_t,int64_t> >::iterator it;
    bool hasdivided = true;
    while (hasdivided)
    {
        hasdivided = false;
        // mapdivided will contain the new fInterface structure
        std::map<int64_t, std::pair<int64_t,int64_t> > mapdivided;
        for (it=fInterfaces.begin(); it!=fInterfaces.end(); it++) {
            int64_t elindex = it->first;
            // if the following condition is not satisfied then the interface is not a boundary
//            if (elindex != it->second.second) {
//                mapdivided[it->first] = it->second;
//                continue;
//            }
            TPZGeoEl *gel = fGMesh->Element(elindex);
            // if the geometric element associated with the interface was not divided
            // then the interface will not be divided either
            if(!gel->HasSubElement())
            {
                mapdivided[it->first] = it->second;
                continue;
            }
            hasdivided = true;
            TPZManVector<TPZGeoEl *,10> subels;
            gel->Divide(subels);
            int64_t nsub = subels.size();
            for (int is=0; is<nsub; is++) {
                if (subels[is]->Index() >= fGeoToMHMDomain.size()) {
                    fGeoToMHMDomain.Resize(subels[is]->Index()+1000, -1);
                }
                fGeoToMHMDomain[subels[is]->Index()] = fGeoToMHMDomain[elindex];
                mapdivided[subels[is]->Index()] = it->second;
                // for boundary elements, the second element is the interface element
                // update the interface data structure
                if(elindex == it->second.second)
                {
                    mapdivided[subels[is]->Index()].second = subels[is]->Index();
                }
            }
        }
        fInterfaces = mapdivided;
    }
//    BuildWrapMesh(fGMesh->Dimension());
//    BuildWrapMesh(fGMesh->Dimension()-1);
    fGeoToMHMDomain.Resize(fGMesh->NElements(), -1);
}